

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

uint64 Time::multDiv(uint64 a,uint64 b,uint64 c)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  uint64 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar5 = a % c;
  uVar6 = b % c;
  uVar4 = (b / c) * uVar5 + (a / c) * b;
  if (uVar6 != 0 && uVar5 != 0) {
    if (c >> 0x20 == 0) {
      uVar4 = uVar4 + (uVar6 * uVar5) / c;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = c;
      lVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0);
      uVar8 = c * lVar2;
      uVar5 = uVar5 * lVar2;
      uVar3 = uVar5 >> 0x20;
      uVar5 = uVar5 & 0xffffffff;
      uVar11 = uVar8 >> 0x20;
      uVar7 = uVar5 * (uVar6 & 0xffffffff);
      uVar10 = uVar5 * (uVar6 >> 0x20) + (uVar7 >> 0x20);
      uVar5 = uVar3 * (uVar6 & 0xffffffff) + (uVar10 & 0xffffffff);
      uVar9 = uVar5 & 0xffffffff;
      uVar6 = ((uVar5 >> 0x20) + (uVar6 >> 0x20) * uVar3 + (uVar10 >> 0x20)) % uVar8;
      uVar5 = uVar6 / uVar11;
      uVar10 = uVar8 & 0xffffffff;
      for (uVar3 = uVar6 % uVar11;
          (uVar5 >> 0x20 != 0 ||
          ((uVar3 >> 0x20 == 0 &&
           (uVar12 = uVar3 << 0x20 | uVar9, uVar12 <= uVar5 * uVar10 && uVar5 * uVar10 - uVar12 != 0
           )))); uVar3 = uVar3 + uVar11) {
        uVar5 = uVar5 - 1;
      }
      uVar6 = (uVar9 | uVar6 << 0x20) - uVar5 * uVar10;
      uVar3 = uVar6 - (uVar8 & 0xffffffff00000000) * uVar5 & 0xffffffff00000000 | uVar6 & 0xffffffff
      ;
      uVar6 = uVar3 / uVar11;
      for (uVar3 = uVar3 % uVar11;
          (uVar6 >> 0x20 != 0 ||
          ((uVar3 >> 0x20 == 0 &&
           (uVar9 = uVar3 << 0x20 | uVar7 & 0xffffffff,
           uVar9 <= uVar6 * uVar10 && uVar6 * uVar10 - uVar9 != 0)))); uVar3 = uVar3 + uVar11) {
        uVar6 = uVar6 - 1;
      }
      uVar4 = (uVar5 << 0x20) + uVar4 + uVar6;
    }
  }
  return uVar4;
}

Assistant:

uint64 multDiv(uint64 a, uint64 b, uint64 c)
    {
        uint64 const base = 1ULL<<32;
        uint64 const maxdiv = (base-1) * base + (base-1);

        // First get the easy thing
        uint64 res = (a/c) * b + (a%c) * (b/c);
        a %= c;
        b %= c;
        // Are we done?
        if (a == 0 || b == 0)
            return res;
        // Is it easy to compute what remain to be added?
        if (c < base)
            return res + (a*b/c);
        // Now 0 < a < c, 0 < b < c, c >= 1ULL
        // Normalize
        uint64 norm = maxdiv/c;
        c *= norm;
        a *= norm;
        // split into 2 digits
        uint64 ah = a / base, al = a % base;
        uint64 bh = b / base, bl = b % base;
        uint64 ch = c / base, cl = c % base;
        // compute the product
        uint64 p0 = al*bl;
        uint64 p1 = p0 / base + al*bh;
        p0 %= base;
        uint64 p2 = p1 / base + ah*bh;
        p1 = (p1 % base) + ah * bl;
        p2 += p1 / base;
        p1 %= base;
        // p2 holds 2 digits, p1 and p0 one
        
        // first digit is easy, not null only in case of overflow
        // uint64 q2 = p2 / c;
        p2 = p2 % c;
        
        // second digit, estimate
        uint64 q1 = p2 / ch;
        // and now adjust
        uint64 rhat = p2 % ch;
        // the loop can be unrolled, it will be executed at most twice for
        // even bases -- three times for odd one -- due to the normalisation above
        while (q1 >= base || (rhat < base && q1*cl > rhat*base+p1)) {
            q1--;
            rhat += ch;
        }
        // subtract
        p1 = ((p2 % base) * base + p1) - q1 * cl;
        p2 = (p2 / base * base + p1 / base) - q1 * ch;
        p1 = p1 % base + (p2 % base) * base;
        
        // now p1 hold 2 digits, p0 one and p2 is to be ignored
        uint64 q0 = p1 / ch;
        rhat = p1 % ch;
        while (q0 >= base || (rhat < base && q0*cl > rhat*base+p0)) {
            q0--;
            rhat += ch;
        }
        // we don't need to do the subtraction (needed only to get the remainder,
        // in which case we have to divide it by norm)
        return res + q0 + q1 * base; // + q2 *base*base
    }